

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.cc
# Opt level: O1

void __thiscall google::protobuf::io::Printer::Printer(Printer *this,ZeroCopyOutputStream *output)

{
  Options options;
  
  options.comment_start._M_len = 2;
  options.variable_delimiter = 0x24;
  options._1_7_ = 0;
  options.annotation_collector = (AnnotationCollector *)0x0;
  options.comment_start._M_str = "//";
  options.ignored_comment_start._M_len = 3;
  options.ignored_comment_start._M_str = "//~";
  options.spaces_per_indent = 2;
  options._56_8_ = 0;
  Printer(this,output,options);
  return;
}

Assistant:

Printer::Printer(ZeroCopyOutputStream* output) : Printer(output, Options{}) {}